

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  AbstractSocketWriter *p;
  string *in_RDX;
  SocketWriter *in_RSI;
  EmptyTestEventListener *in_RDI;
  StreamingListener *unaff_retaddr;
  string *in_stack_ffffffffffffffe0;
  
  EmptyTestEventListener::EmptyTestEventListener(in_RDI);
  (in_RDI->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_03745440;
  p = (AbstractSocketWriter *)operator_new(0x50);
  SocketWriter::SocketWriter(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  scoped_ptr<testing::internal::StreamingListener::AbstractSocketWriter>::scoped_ptr
            ((scoped_ptr<testing::internal::StreamingListener::AbstractSocketWriter> *)(in_RDI + 1),
             p);
  Start(unaff_retaddr);
  return;
}

Assistant:

StreamingListener(const string& host, const string& port)
      : socket_writer_(new SocketWriter(host, port)) { Start(); }